

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O3

void __thiscall IOContextDemuxer::skip_bytes(IOContextDemuxer *this,uint64_t size)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  uint32_t readedBytes;
  int readRez;
  uint local_30;
  int local_2c;
  
  if (size != 0) {
    local_30 = 0;
    local_2c = 0;
    puVar1 = this->m_curPos;
    if (puVar1 < this->m_bufEnd) {
      uVar3 = (long)this->m_bufEnd - (long)puVar1;
      if (size <= uVar3) {
        uVar3 = size;
      }
      this->m_processedBytes = this->m_processedBytes + uVar3;
      this->m_curPos = puVar1 + uVar3;
      size = size - uVar3;
      if (size == 0) {
        return;
      }
    }
    do {
      iVar2 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                        (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_30,&local_2c,0)
      ;
      uVar3 = (ulong)local_30;
      if ((local_30 != 0) && (local_2c == 0)) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
        uVar3 = (ulong)local_30;
      }
      puVar1 = (uint8_t *)(CONCAT44(extraout_var,iVar2) + 0xbc);
      this->m_curPos = puVar1;
      this->m_bufEnd = (uint8_t *)(uVar3 + CONCAT44(extraout_var,iVar2) + 0xbc);
      if ((int)uVar3 == 0) {
        return;
      }
      if (size < uVar3) {
        uVar3 = size;
      }
      this->m_curPos = puVar1 + uVar3;
      this->m_processedBytes = this->m_processedBytes + uVar3;
      size = size - uVar3;
    } while (size != 0);
  }
  return;
}

Assistant:

void IOContextDemuxer::skip_bytes(const uint64_t size)
{
    if (size == 0)
        return;
    uint32_t readedBytes = 0;
    int readRez = 0;
    uint64_t skipLeft = size;

    if (m_curPos < m_bufEnd)
    {
        const uint64_t copyLen = min((uint64_t)(m_bufEnd - m_curPos), skipLeft);
        skipLeft -= copyLen;
        m_curPos += copyLen;
        m_processedBytes += copyLen;
    }
    /*
    while (skipLeft > 4LL * m_fileBlockSize)
    {
        m_bufferedReader->seek(m_readerID, m_fileBlockSize);
        m_processedBytes += m_fileBlockSize;
        skipLeft -= m_fileBlockSize;
    }
    */
    while (skipLeft > 0)
    {
        uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);
        if (readedBytes > 0 && readRez == 0)
            m_bufferedReader->notify(m_readerID, readedBytes);
        m_curPos = data + 188;
        m_bufEnd = m_curPos + readedBytes;
        if (readedBytes == 0)
            break;
        const uint64_t copyLen = min((uint64_t)readedBytes, skipLeft);
        m_curPos += copyLen;
        m_processedBytes += copyLen;
        skipLeft -= copyLen;
    }
}